

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

value_type __thiscall
andres::
BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>
::operator()(BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>
             *this,int it)

{
  reference piVar1;
  reference pfVar2;
  
  piVar1 = View<int,false,std::allocator<unsigned_long>>::operator()
                     (*(View<int,false,std::allocator<unsigned_long>> **)this,it);
  pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                     (*(View<float,false,std::allocator<unsigned_long>> **)(this + 8),it);
  return (float)*piVar1 + *pfVar2;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }